

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultiVertexArrayStrideTests::addStrideCases
          (MultiVertexArrayStrideTests *this,Spec *spec,int depth)

{
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
  *this_00;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_01;
  long lVar2;
  Spec *this_02;
  GLValue GVar3;
  string desc;
  string name;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ArraySpec *local_c8;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  *local_c0;
  char *local_b8;
  int local_b0;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  local_a8;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  undefined1 local_70 [32];
  GLValue local_50;
  GLValue local_40;
  
  if (depth == 0) {
    this_02 = spec;
    getTestName_abi_cxx11_((string *)local_70,(MultiVertexArrayStrideTests *)spec,spec);
    getTestName_abi_cxx11_((string *)local_e8,(MultiVertexArrayStrideTests *)this_02,spec);
    this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_01,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,spec,(char *)local_70._0_8_,
               (char *)local_e8._0_8_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  else {
    this_00 = (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)(local_e8 + 0x10);
    local_c0 = &spec->arrays;
    lVar2 = 0;
    do {
      if (lVar2 == 4) {
        iVar1 = deqp::gls::Array::inputTypeSize(INPUTTYPE_FLOAT);
        iVar1 = iVar1 * 2;
      }
      else {
        iVar1 = *(int *)((long)&DAT_01c05fb0 + lVar2);
      }
      GVar3 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      aStack_78 = GVar3.field_1;
      local_80 = GVar3.type;
      GVar3 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      aStack_88 = GVar3.field_1;
      local_90 = GVar3.type;
      max_._4_4_ = uStack_8c;
      max_.type = local_90;
      GVar3._4_4_ = uStack_7c;
      GVar3.type = local_80;
      GVar3.field_1 = aStack_78;
      max_.field_1 = aStack_88;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_70,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,STORAGE_USER,
                 USAGE_DYNAMIC_DRAW,2,0,iVar1,false,GVar3,max_);
      local_e8._8_4_ = spec->first;
      local_e8._0_8_ = *(undefined8 *)spec;
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::vector((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                *)this_00,local_c0);
      if ((ArraySpec *)local_d8._8_8_ == local_c8) {
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  (this_00,(iterator)local_d8._8_8_,(ArraySpec *)local_70);
      }
      else {
        ((GLValue *)(local_d8._8_8_ + 0x30))->type = local_40.type;
        *(undefined4 *)&((GLValue *)(local_d8._8_8_ + 0x30))->field_0x4 = local_40._4_4_;
        *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(local_d8._8_8_ + 0x38) = local_40.field_1;
        ((GLValue *)(local_d8._8_8_ + 0x20))->type = local_50.type;
        *(undefined4 *)&((GLValue *)(local_d8._8_8_ + 0x20))->field_0x4 = local_50._4_4_;
        *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(local_d8._8_8_ + 0x28) = local_50.field_1;
        *(undefined8 *)(local_d8._8_8_ + 0x10) = local_70._16_8_;
        *(undefined8 *)(local_d8._8_8_ + 0x18) = local_70._24_8_;
        *(undefined8 *)local_d8._8_8_ = local_70._0_8_;
        *(undefined8 *)(local_d8._8_8_ + 8) = local_70._8_8_;
        local_d8._8_8_ = local_d8._8_8_ + 0x40;
      }
      local_b0 = local_e8._8_4_;
      local_b8 = (char *)local_e8._0_8_;
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::vector(&local_a8,
               (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                *)this_00);
      addStrideCases(this,(Spec *)&local_b8,depth + -1);
      if (local_a8.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_d8._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_d8._M_allocated_capacity,(long)local_c8 - local_d8._0_8_);
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
  }
  return;
}

Assistant:

void MultiVertexArrayStrideTests::addStrideCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);
		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	int strides[]	= {0, -1, 17, 32};

	for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
	{
		const int componentCount = 2;
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
														Array::OUTPUTTYPE_VEC2,
														Array::STORAGE_USER,
														Array::USAGE_DYNAMIC_DRAW,
														componentCount,
														0,
														(strides[strideNdx] >= 0 ? strides[strideNdx] : componentCount * Array::inputTypeSize(Array::INPUTTYPE_FLOAT)),
														false,
														GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
														GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addStrideCases(_spec, depth-1);
	}
}